

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RX.cpp
# Opt level: O2

void __thiscall RX::RX(RX *this)

{
  allocator<char> local_9;
  
  this->_compiled = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->_pattern,"",&local_9);
  this->_case_sensitive = true;
  return;
}

Assistant:

RX::RX ()
: _compiled (false)
, _pattern ("")
, _case_sensitive (true)
{
}